

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxObjectiveFunction.cpp
# Opt level: O0

void __thiscall
OpenMD::BoxObjectiveFunction::getGrad
          (BoxObjectiveFunction *this,DynamicVector<double,_std::allocator<double>_> *grad)

{
  double *pdVar1;
  reference pvVar2;
  long in_RDI;
  SquareMatrix3<double> *m1;
  RealType RVar3;
  DynamicVector<double,_std::allocator<double>_> *this_00;
  int j;
  RealType V;
  Mat3x3d tao;
  RealType ddm;
  Mat3x3d idm;
  Vector<double,_6U> lstress;
  Mat3x3d pressureTensor;
  SquareMatrix3<double> *in_stack_fffffffffffffdb8;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffdc0;
  Vector<double,_6U> *in_stack_fffffffffffffdc8;
  SquareMatrix3<double> *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  uint i;
  SquareMatrix3<double> *in_stack_fffffffffffffe58;
  double local_90;
  Vector<double,_6U> local_88;
  RectMatrix<double,_3U,_3U> local_58;
  
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x2d88e1);
  local_90 = 0.0;
  Vector<double,_6U>::Vector(&local_88,&local_90);
  SquareMatrix3<double>::inverse(in_stack_fffffffffffffe58);
  m1 = (SquareMatrix3<double> *)
       SquareMatrix3<double>::determinant((SquareMatrix3<double> *)(in_RDI + 0x38));
  Thermo::getPressureTensor
            ((Thermo *)
             tao.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d897d);
  RectMatrix<double,_3U,_3U>::negate(&local_58);
  RectMatrix<double,_3U,_3U>::operator*=
            (in_stack_fffffffffffffdc0,(double)in_stack_fffffffffffffdb8);
  OpenMD::operator*(m1,in_stack_fffffffffffffde0);
  OpenMD::operator*(m1,in_stack_fffffffffffffde0);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d89ee);
  RectMatrix<double,_3U,_3U>::operator*=
            (in_stack_fffffffffffffdc0,(double)in_stack_fffffffffffffdb8);
  SquareMatrix3<double>::toVoigtTensor
            ((SquareMatrix3<double> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8))
  ;
  Vector<double,_6U>::operator=
            (in_stack_fffffffffffffdc8,(Vector<double,_6U> *)in_stack_fffffffffffffdc0);
  RVar3 = Thermo::getVolume((Thermo *)in_stack_fffffffffffffdc0);
  for (i = 0; (int)i < 6; i = i + 1) {
    pdVar1 = Vector<double,_6U>::operator[](&local_88,i);
    this_00 = (DynamicVector<double,_std::allocator<double>_> *)(RVar3 * *pdVar1);
    pvVar2 = DynamicVector<double,_std::allocator<double>_>::operator[]
                       (this_00,(size_type)in_stack_fffffffffffffdb8);
    *pvVar2 = (value_type)this_00;
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d8b7d);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d8b8a);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d8b97);
  return;
}

Assistant:

void BoxObjectiveFunction::getGrad(DynamicVector<RealType>& grad) {
    Mat3x3d pressureTensor;
    Vector<RealType, 6> lstress(0.0);

    // Find the Lagragian stress tensor, τ, from the physical
    // stress tensor, σ, that was computed from the pressureTensor
    // in this code.
    // τ = det(1+ε) (1+ε)^−1 · σ · (1+ε)^−1
    // (Note that 1+ε is the deformation tensor computed above.)

    Mat3x3d idm  = deformation_.inverse();
    RealType ddm = deformation_.determinant();

    pressureTensor = thermo.getPressureTensor();
    pressureTensor.negate();
    pressureTensor *= Constants::elasticConvert;

    Mat3x3d tao = idm * (pressureTensor * idm);
    tao *= ddm;

    lstress    = tao.toVoigtTensor();
    RealType V = thermo.getVolume();

    for (int j = 0; j < 6; j++) {
      grad[j] = V * lstress[j];
    }
  }